

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)21>_> * __thiscall
vk::DescriptorPoolBuilder::build
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,DescriptorPoolBuilder *this
          ,DeviceInterface *vk,VkDevice device,VkDescriptorPoolCreateFlags flags,deUint32 maxSets)

{
  bool bVar1;
  size_type sVar2;
  const_reference local_80;
  undefined1 local_60 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize *typeCountPtr;
  deUint32 maxSets_local;
  VkDescriptorPoolCreateFlags flags_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  DescriptorPoolBuilder *this_local;
  
  bVar1 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::empty
                    (&this->m_counts);
  if (bVar1) {
    local_80 = (const_reference)0x0;
  }
  else {
    local_80 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
               operator[](&this->m_counts,0);
  }
  createInfo.pPoolSizes = local_80;
  local_60._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = flags;
  createInfo.pNext._4_4_ = maxSets;
  sVar2 = std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::size
                    (&this->m_counts);
  createInfo.flags = (VkDescriptorPoolCreateFlags)sVar2;
  createInfo._24_8_ = createInfo.pPoolSizes;
  createDescriptorPool
            (__return_storage_ptr__,vk,device,(VkDescriptorPoolCreateInfo *)local_60,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorPool> DescriptorPoolBuilder::build (const DeviceInterface& vk, VkDevice device, VkDescriptorPoolCreateFlags flags, deUint32 maxSets) const
{
	const VkDescriptorPoolSize* const	typeCountPtr	= (m_counts.empty()) ? (DE_NULL) : (&m_counts[0]);
	const VkDescriptorPoolCreateInfo	createInfo		=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
		DE_NULL,
		flags,
		maxSets,
		(deUint32)m_counts.size(),		// poolSizeCount
		typeCountPtr,					// pPoolSizes
	};

	return createDescriptorPool(vk, device, &createInfo);
}